

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::upPartials
          (BeagleCPUImpl<float,_1,_0> *this,bool byPartition,int *operations,int count,
          int cumulativeScaleIndex)

{
  int iVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  int *piVar6;
  int *piVar7;
  float *pfVar8;
  float *pfVar9;
  bool bVar10;
  bool bVar11;
  _func_int **pp_Var12;
  uint uVar13;
  int *piVar14;
  ulong uVar15;
  undefined8 uVar16;
  int *piVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  undefined4 in_register_00000084;
  int iVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  float *local_b0;
  float *local_a8;
  int scalingIndices [2];
  long local_60;
  int readScalingIndex;
  ulong local_50;
  long local_48;
  int *local_40;
  long local_38;
  
  local_60 = CONCAT44(in_register_00000084,cumulativeScaleIndex);
  if (cumulativeScaleIndex == -1) {
    local_a8 = (float *)0x0;
  }
  else {
    local_a8 = this->gScaleBuffers[cumulativeScaleIndex];
  }
  if (0 < count) {
    local_40 = &this->kPatternCount;
    piVar17 = operations + 8;
    uVar23 = (ulong)(uint)count;
    local_48 = (ulong)byPartition * 8 + 0x1c;
    do {
      local_38 = (long)piVar17[-8];
      iVar1 = piVar17[-7];
      readScalingIndex = piVar17[-6];
      uVar19 = 0;
      if (byPartition) {
        uVar19 = piVar17[-1];
        local_60 = (long)*piVar17;
        if (local_60 == -1) {
          local_a8 = (float *)0x0;
          local_60 = 0xffffffff;
        }
        else {
          local_a8 = this->gScaleBuffers[local_60];
        }
      }
      uVar15 = 0;
      piVar14 = local_40;
      if (byPartition) {
        piVar14 = this->gPatternPartitionsStartPatterns + (long)(int)uVar19 + 1;
        uVar15 = (ulong)(uint)piVar14[-1];
      }
      iVar22 = piVar17[-3];
      ppfVar2 = this->gPartials;
      iVar21 = piVar17[-5];
      pfVar3 = ppfVar2[iVar22];
      pfVar4 = ppfVar2[iVar21];
      pfVar5 = ppfVar2[local_38];
      piVar6 = this->gTipStates[iVar21];
      piVar7 = this->gTipStates[iVar22];
      pfVar8 = this->gTransitionMatrices[piVar17[-4]];
      pfVar9 = this->gTransitionMatrices[piVar17[-2]];
      uVar20 = (ulong)(uint)*piVar14;
      if ((char)this->kFlags < '\0') {
        bVar24 = piVar6 == (int *)0x0 && piVar7 == (int *)0x0;
        this->gActiveScalingFactors[local_38 - this->kTipCount] = 0;
LAB_00133db2:
        bVar10 = false;
        bVar11 = false;
        local_b0 = (float *)0x0;
LAB_00133dd7:
        if (piVar6 == (int *)0x0) {
          if (piVar7 == (int *)0x0) {
            if (bVar24) {
              lVar18 = local_38 - this->kTipCount;
              (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x58])
                        (this,pfVar5,pfVar4,pfVar8,pfVar3,pfVar9,
                         this->gActiveScalingFactors + lVar18);
              if (this->gActiveScalingFactors[lVar18] != 0) {
                (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x5b])
                          (this,pfVar5,this->gAutoScaleBuffers[lVar18]);
              }
            }
            else {
              pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
              if (bVar10) {
                (*pp_Var12[0x57])(this,pfVar5,pfVar4,pfVar8,pfVar3,pfVar9,local_b0,uVar15,uVar20);
              }
              else {
                (*pp_Var12[0x43])(this,pfVar5,pfVar4,pfVar8,pfVar3,pfVar9,uVar15,uVar20);
                if (bVar11) goto LAB_00134129;
              }
            }
          }
          else {
            pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
            if (!bVar10) {
              (*pp_Var12[0x42])(this,pfVar5,piVar7,pfVar9,pfVar4,pfVar8,uVar15,uVar20);
              goto joined_r0x0013400f;
            }
            (*pp_Var12[0x55])(this,pfVar5,piVar7,pfVar9,pfVar4,pfVar8,local_b0,uVar15,uVar20);
          }
        }
        else {
          pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
          if (piVar7 == (int *)0x0) {
            if (!bVar10) {
              (*pp_Var12[0x42])(this,pfVar5,piVar6,pfVar8,pfVar3,pfVar9,uVar15,uVar20);
              goto joined_r0x0013400f;
            }
            (*pp_Var12[0x55])(this,pfVar5,piVar6,pfVar8,pfVar3,pfVar9,local_b0,uVar15,uVar20);
          }
          else if (bVar10) {
            (*pp_Var12[0x54])(this,pfVar5,piVar6,pfVar8,piVar7,pfVar9,local_b0,uVar15,uVar20);
          }
          else {
            (*pp_Var12[0x41])(this,pfVar5,piVar6,pfVar8,piVar7,pfVar9,uVar15,uVar20);
joined_r0x0013400f:
            if (bVar11) {
              pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
              goto joined_r0x00134073;
            }
          }
        }
      }
      else {
        uVar13 = (uint)this->kFlags;
        if ((uVar13 >> 8 & 1) != 0) {
          local_b0 = this->gScaleBuffers[local_38 - this->kTipCount];
LAB_00133dd0:
          bVar11 = true;
          bVar24 = false;
          bVar10 = false;
          goto LAB_00133dd7;
        }
        if ((uVar13 >> 0x19 & 1) == 0) {
          if (iVar1 < 0) {
            if (readScalingIndex < 0) goto LAB_001340de;
            bVar11 = false;
            local_b0 = this->gScaleBuffers[(uint)readScalingIndex];
            bVar10 = true;
            bVar24 = false;
            goto LAB_00133dd7;
          }
          local_b0 = this->gScaleBuffers[iVar1];
          goto LAB_00133dd0;
        }
        if (piVar6 != (int *)0x0 || piVar7 != (int *)0x0) {
LAB_001340de:
          bVar24 = false;
          goto LAB_00133db2;
        }
        local_50 = uVar20;
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x22])(this,&readScalingIndex,1,local_60);
        local_b0 = this->gScaleBuffers[iVar1];
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x43])
                  (this,pfVar5,pfVar4,pfVar8,pfVar3,pfVar9,uVar15,local_50);
LAB_00134129:
        pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
joined_r0x00134073:
        if (byPartition) {
          (*pp_Var12[0x5a])(this,pfVar5,local_b0,local_a8,0,(ulong)uVar19);
        }
        else {
          (*pp_Var12[0x59])(this,pfVar5,local_b0,local_a8,0);
        }
      }
      if ((this->kFlags & 0x100) != 0) {
        iVar1 = this->kTipCount;
        iVar22 = iVar22 - iVar1;
        iVar21 = iVar21 - iVar1;
        if ((iVar21 < 0) || (iVar22 < 0)) {
          if ((iVar21 < 0) && (iVar21 = iVar22, iVar22 < 0)) goto LAB_001341d6;
          scalingIndices[0] = iVar21;
          pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
          uVar16 = 1;
        }
        else {
          uVar16 = 2;
          pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
          scalingIndices[0] = iVar21;
          scalingIndices[1] = iVar22;
        }
        (*pp_Var12[0x20])(this,scalingIndices,uVar16,(ulong)(uint)((int)local_38 - iVar1));
      }
LAB_001341d6:
      piVar17 = (int *)((long)piVar17 + local_48);
      uVar23 = uVar23 - 1;
    } while (uVar23 != 0);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPartials(bool byPartition,
                                                  const int* operations,
                                                  int count,
                                                  int cumulativeScaleIndex) {

    REALTYPE* cumulativeScaleBuffer = NULL;
    if (cumulativeScaleIndex != BEAGLE_OP_NONE)
        cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];

    for (int op = 0; op < count; op++) {

        int numOps = BEAGLE_OP_COUNT;
        if (byPartition)
            numOps = BEAGLE_PARTITION_OP_COUNT;

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr, "op[%d] = ", op);
            for (int j = 0; j < numOps; j++) {
                std::cerr << operations[op*numOps+j] << " ";
            }
            fprintf(stderr, "\n");
        }

        const int parIndex = operations[op * numOps];
        const int writeScalingIndex = operations[op * numOps + 1];
        const int readScalingIndex = operations[op * numOps + 2];
        const int child1Index = operations[op * numOps + 3];
        const int child1TransMatIndex = operations[op * numOps + 4];
        const int child2Index = operations[op * numOps + 5];
        const int child2TransMatIndex = operations[op * numOps + 6];
        int currentPartition = 0;
        if (byPartition) {
            currentPartition = operations[op * numOps + 7];
            cumulativeScaleIndex = operations[op * numOps + 8];
            if (cumulativeScaleIndex != BEAGLE_OP_NONE)
                cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
            else
                cumulativeScaleBuffer = NULL;
        }

        const REALTYPE* partials1 = gPartials[child1Index];
        const REALTYPE* partials2 = gPartials[child2Index];

        const int* tipStates1 = gTipStates[child1Index];
        const int* tipStates2 = gTipStates[child2Index];

        const REALTYPE* matrices1 = gTransitionMatrices[child1TransMatIndex];
        const REALTYPE* matrices2 = gTransitionMatrices[child2TransMatIndex];

        REALTYPE* destPartials = gPartials[parIndex];

        int startPattern = 0;
        int endPattern = kPatternCount;
        if (byPartition) {
            startPattern = gPatternPartitionsStartPatterns[currentPartition];
            endPattern = gPatternPartitionsStartPatterns[currentPartition + 1];
        }

        int rescale = BEAGLE_OP_NONE;
        REALTYPE* scalingFactors = NULL;

        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            gActiveScalingFactors[parIndex - kTipCount] = 0;
            if (tipStates1 == 0 && tipStates2 == 0)
                rescale = 2;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            rescale = 1;
            scalingFactors = gScaleBuffers[parIndex - kTipCount];
        } else if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) { // TODO: this is a quick and dirty implementation just so it returns correct results
            if (tipStates1 == 0 && tipStates2 == 0) {
                rescale = 1;
                removeScaleFactors(&readScalingIndex, 1, cumulativeScaleIndex);
                scalingFactors = gScaleBuffers[writeScalingIndex];
            }
        } else if (writeScalingIndex >= 0) {
            rescale = 1;
            scalingFactors = gScaleBuffers[writeScalingIndex];
        } else if (readScalingIndex >= 0) {
            rescale = 0;
            scalingFactors = gScaleBuffers[readScalingIndex];
        }

        if (DEBUGGING_OUTPUT) {
            std::cerr << "Rescale= " << rescale << " writeIndex= " << writeScalingIndex
                     << " readIndex = " << readScalingIndex << "\n";
        }

        if (tipStates1 != NULL) {
            if (tipStates2 != NULL ) {
                if (rescale == 0) { // Use fixed scaleFactors
                    calcStatesStatesFixedScaling(destPartials, tipStates1, matrices1, tipStates2,
                                                 matrices2, scalingFactors, startPattern, endPattern);
                } else {
                    // First compute without any scaling
                    calcStatesStates(destPartials, tipStates1, matrices1, tipStates2, matrices2,
                                     startPattern, endPattern);
                    if (rescale == 1) { // Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            } else {
                if (rescale == 0) {
                    calcStatesPartialsFixedScaling(destPartials, tipStates1, matrices1, partials2,
                                                   matrices2, scalingFactors, startPattern, endPattern);
                } else {
                    calcStatesPartials(destPartials, tipStates1, matrices1, partials2, matrices2,
                                       startPattern, endPattern);
                    if (rescale == 1) { // Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            }
        } else {
            if (tipStates2 != NULL) {
                if (rescale == 0) {
                    calcStatesPartialsFixedScaling(destPartials,tipStates2,matrices2,partials1,matrices1,
                                                   scalingFactors, startPattern, endPattern);
                } else {
                    calcStatesPartials(destPartials, tipStates2, matrices2, partials1, matrices1,
                                       startPattern, endPattern);
                    if (rescale == 1) {// Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            } else {
                if (rescale == 2) {
                    int sIndex = parIndex - kTipCount;
                    calcPartialsPartialsAutoScaling(destPartials,partials1,matrices1,partials2,matrices2,
                                                     &gActiveScalingFactors[sIndex]);
                    if (gActiveScalingFactors[sIndex])
                        autoRescalePartials(destPartials, gAutoScaleBuffers[sIndex]);

                } else if (rescale == 0) {
                    calcPartialsPartialsFixedScaling(destPartials,partials1,matrices1,partials2,
                                                     matrices2,scalingFactors,startPattern,endPattern);
                } else {
                    calcPartialsPartials(destPartials, partials1, matrices1, partials2, matrices2,
                                         startPattern, endPattern);
                    if (rescale == 1) {// Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            }
        }

        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            int parScalingIndex = parIndex - kTipCount;
            int child1ScalingIndex = child1Index - kTipCount;
            int child2ScalingIndex = child2Index - kTipCount;
            if (child1ScalingIndex >= 0 && child2ScalingIndex >= 0) {
                int scalingIndices[2] = {child1ScalingIndex, child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 2, parScalingIndex);
            } else if (child1ScalingIndex >= 0) {
                int scalingIndices[1] = {child1ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
            } else if (child2ScalingIndex >= 0) {
                int scalingIndices[1] = {child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
            }
        }

        if (DEBUGGING_OUTPUT) {
            if (scalingFactors != NULL && rescale == 0) {
                for(int i=0; i<kPatternCount; i++)
                    fprintf(stderr,"old scaleFactor[%d] = %.5f\n",i,scalingFactors[i]);
            }
            fprintf(stderr,"Result partials:\n");
            for(int i = 0; i < kPartialsSize; i++)
                fprintf(stderr,"destP[%d] = %.5f\n",i,destPartials[i]);
        }
    }

    return BEAGLE_SUCCESS;
}